

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson.c
# Opt level: O0

int bson_compare(bson_t *bson,bson_t *other)

{
  int iVar1;
  uint8_t *puVar2;
  ulong __n;
  uint8_t *puVar3;
  ulong uVar4;
  uint local_64;
  size_t local_60;
  long local_48;
  int64_t ret;
  size_t len2;
  size_t len1;
  uint8_t *data2;
  uint8_t *data1;
  bson_t *other_local;
  bson_t *bson_local;
  
  puVar2 = _bson_data(bson);
  __n = (ulong)(bson->len - 4);
  puVar3 = _bson_data(other);
  uVar4 = (ulong)(other->len - 4);
  if (__n == uVar4) {
    bson_local._4_4_ = memcmp(puVar2 + 4,puVar3 + 4,__n);
  }
  else {
    local_60 = uVar4;
    if (__n < uVar4) {
      local_60 = __n;
    }
    iVar1 = memcmp(puVar2 + 4,puVar3 + 4,local_60);
    local_48 = (long)iVar1;
    if (local_48 == 0) {
      local_48 = __n - uVar4;
    }
    if (local_48 < 0) {
      local_64 = 0xffffffff;
    }
    else {
      local_64 = (uint)(0 < local_48);
    }
    bson_local._4_4_ = local_64;
  }
  return bson_local._4_4_;
}

Assistant:

int
bson_compare (const bson_t *bson, const bson_t *other)
{
   const uint8_t *data1;
   const uint8_t *data2;
   size_t len1;
   size_t len2;
   int64_t ret;

   data1 = _bson_data (bson) + 4;
   len1 = bson->len - 4;

   data2 = _bson_data (other) + 4;
   len2 = other->len - 4;

   if (len1 == len2) {
      return memcmp (data1, data2, len1);
   }

   ret = memcmp (data1, data2, BSON_MIN (len1, len2));

   if (ret == 0) {
      ret = (int64_t) (len1 - len2);
   }

   return (ret < 0) ? -1 : (ret > 0);
}